

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O0

wchar_t scatter_ext(chunk_conflict *c,loc *places,wchar_t n,loc grid,wchar_t d,_Bool need_los,
                   _func__Bool_chunk_ptr_loc *pred)

{
  loc_conflict grid_00;
  loc grid2;
  loc grid2_00;
  loc lVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  void *p;
  int local_74;
  wchar_t local_70;
  wchar_t local_6c;
  int local_58;
  wchar_t local_54;
  wchar_t local_50;
  wchar_t wStack_44;
  wchar_t choice;
  loc g;
  wchar_t nfeas;
  loc *feas;
  wchar_t result;
  _Bool need_los_local;
  wchar_t d_local;
  wchar_t n_local;
  loc *places_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  feas._0_4_ = L'\0';
  local_50 = d;
  if (d < L'\x01') {
    local_50 = L'\0';
  }
  if (local_50 * 2 + 1 < c->width) {
    local_54 = d;
    if (d < L'\x01') {
      local_54 = L'\0';
    }
    local_58 = local_54 * 2 + 1;
  }
  else {
    local_58 = c->width;
  }
  local_6c = d;
  if (d < L'\x01') {
    local_6c = L'\0';
  }
  if (local_6c * 2 + 1 < c->height) {
    local_70 = d;
    if (d < L'\x01') {
      local_70 = L'\0';
    }
    local_74 = local_70 * 2 + 1;
  }
  else {
    local_74 = c->height;
  }
  p = mem_alloc((long)local_58 * (long)local_74 * 8);
  g.x = 0;
  c_local._4_4_ = grid.y;
  for (choice = c_local._4_4_ - d; choice <= c_local._4_4_ + d; choice = choice + L'\x01') {
    c_local._0_4_ = grid.x;
    for (wStack_44 = (int)c_local - d; wStack_44 <= (int)c_local + d;
        wStack_44 = wStack_44 + L'\x01') {
      grid_00.y = choice;
      grid_00.x = wStack_44;
      _Var2 = square_in_bounds_fully((chunk *)c,grid_00);
      if ((((_Var2) &&
           ((d < L'\x02' ||
            (grid2.y = choice, grid2.x = wStack_44, wVar3 = distance(grid,grid2), wVar3 <= d)))) &&
          ((!need_los ||
           (grid2_00.y = choice, grid2_00.x = wStack_44, _Var2 = los(c,grid,grid2_00), _Var2)))) &&
         ((pred == (_func__Bool_chunk_ptr_loc *)0x0 ||
          (lVar1.y = choice, lVar1.x = wStack_44, _Var2 = (*pred)(c,lVar1), _Var2)))) {
        *(ulong *)((long)p + (long)g.x * 8) = CONCAT44(choice,wStack_44);
        g.x = g.x + 1;
      }
    }
  }
  while ((wchar_t)feas < n && 0 < g.x) {
    uVar4 = Rand_div(g.x);
    places[(wchar_t)feas] = *(loc *)((long)p + (long)(int)uVar4 * 8);
    feas._0_4_ = (wchar_t)feas + L'\x01';
    g.x = g.x + -1;
    *(undefined8 *)((long)p + (long)(int)uVar4 * 8) = *(undefined8 *)((long)p + (long)g.x * 8);
  }
  mem_free(p);
  return (wchar_t)feas;
}

Assistant:

int scatter_ext(struct chunk *c, struct loc *places, int n, struct loc grid,
		int d, bool need_los, bool (*pred)(struct chunk *, struct loc))
{
	int result = 0;
	/* Stores feasible locations. */
	struct loc *feas = mem_alloc(MIN(c->width, (1 + 2 * MAX(0, d)))
			* (size_t) MIN(c->height, (1 + 2 * MAX(0, d)))
			* sizeof(*feas));
	int nfeas = 0;
	struct loc g;

	/* Get the feasible locations. */
	for (g.y = grid.y - d; g.y <= grid.y + d; ++g.y) {
		for (g.x = grid.x - d; g.x <= grid.x + d; ++g.x) {
			if (!square_in_bounds_fully(c, g)) continue;
			if (d > 1 && distance(grid, g) > d) continue;
			if (need_los && !los(c, grid, g)) continue;
			if (pred && !(*pred)(c, g)) continue;
			feas[nfeas] = g;
			++nfeas;
		}
	}

	/* Assemble the result. */
	while (result < n && nfeas > 0) {
		/* Choose one at random and append it to the outgoing list. */
		int choice = randint0(nfeas);

		places[result] = feas[choice];
		++result;
		/* Shift the last feasible one to replace the one selected. */
		--nfeas;
		feas[choice] = feas[nfeas];
	}

	mem_free(feas);
	return result;
}